

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall
pbrt::syntactic::Texture::Texture(Texture *this,string *name,string *texelType,string *mapType)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  
  ParamSet::ParamSet((ParamSet *)0x1904db);
  *in_RDI = &PTR_toString_abi_cxx11__0021bae8;
  std::__cxx11::string::string((string *)(in_RDI + 7),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0xb),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0xf),in_RCX);
  std::shared_ptr<pbrt::syntactic::Attributes>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Attributes> *)0x19053e);
  return;
}

Assistant:

Texture(const std::string &name,
              const std::string &texelType,
              const std::string &mapType) 
        : name(name), texelType(texelType), mapType(mapType)
        {}